

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::error_or<pstore::romfs::descriptor>::error_or<pstore::romfs::descriptor,void>
          (error_or<pstore::romfs::descriptor> *this,descriptor *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  descriptor *pdVar3;
  
  this->has_error_ = false;
  pdVar3 = value_storage_impl<pstore::error_or<pstore::romfs::descriptor>&,pstore::romfs::descriptor>
                     (this);
  (pdVar3->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (other->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (other->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (other->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pdVar3->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (pdVar3->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (other->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

explicit error_or (Other && other)
                : has_error_{false} {
            new (get_storage ()) storage_type (std::forward<Other> (other));
        }